

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  int iVar1;
  secp256k1_scalar sec;
  secp256k1_scalar local_28;
  
  if (seckey == (uchar *)0x0) {
    (*(ctx->illegal_callback).fn)("seckey != NULL",(ctx->illegal_callback).data);
    iVar1 = 0;
  }
  else {
    iVar1 = secp256k1_scalar_set_b32_seckey(&local_28,seckey);
  }
  return iVar1;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}